

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::Texture3DMipmapCase::iterate(Texture3DMipmapCase *this)

{
  TextureFormat TVar1;
  CoordType CVar2;
  CoordType CVar3;
  Texture3D *pTVar4;
  RenderContext *context;
  TestLog *pTVar5;
  int iVar6;
  int iVar7;
  int i;
  int iVar8;
  int iVar9;
  deUint32 dVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar12;
  RenderTarget *pRVar13;
  long lVar14;
  Surface *pSVar15;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  int iVar16;
  void *pvVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  int local_4d4;
  ulong local_4c0;
  RandomViewport viewport;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  long local_480;
  TextureRenderer *local_478;
  long local_470;
  vector<float,_std::allocator<float>_> texCoord;
  undefined1 local_448 [48];
  undefined1 local_418 [40];
  Surface renderedFrame;
  Surface referenceFrame;
  undefined1 local_3c0 [40];
  Surface errorMask;
  LodPrecision lodPrec;
  Texture3DView local_370;
  ulong local_360;
  PixelFormat *local_358;
  Texture3D *local_350;
  Vector<int,_4> res_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  _Alloc_hider local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [6];
  ReferenceParams sampleParams;
  undefined1 local_21c [24];
  undefined8 local_204;
  _func_int **pp_Stack_1fc;
  BVec4 local_1f4;
  undefined1 local_1f0 [8];
  _func_int **pp_Stack_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  _Alloc_hider local_1d0;
  undefined4 local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1c0 [4];
  ios_base local_178 [264];
  TextureFormatInfo fmtInfo;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var,iVar8);
  pTVar4 = this->m_texture;
  tcu::getTextureFormatInfo(&fmtInfo,(TextureFormat *)&pTVar4->m_refTexture);
  iVar8 = (pTVar4->m_refTexture).m_width;
  iVar11 = (pTVar4->m_refTexture).m_height;
  local_350 = pTVar4;
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  dVar10 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar9),iVar8 << 2,iVar11 << 2,dVar10
            );
  CVar2 = this->m_coordType;
  iVar8 = viewport.width + 3;
  if (-1 < viewport.width) {
    iVar8 = viewport.width;
  }
  iVar11 = viewport.height + 3;
  if (-1 < viewport.height) {
    iVar11 = viewport.height;
  }
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&sampleParams,TEXTURETYPE_3D);
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::mapGLSampler((Sampler *)local_1f0,this->m_wrapS,this->m_wrapT,this->m_wrapR,this->m_minFilter
                    ,0x2600);
  sampleParams.sampler.magFilter = local_1e0._M_allocated_capacity._0_4_;
  sampleParams.sampler.lodThreshold = (float)local_1e0._M_allocated_capacity._4_4_;
  sampleParams.sampler.normalizedCoords = (bool)local_1e0._M_local_buf[8];
  sampleParams.sampler._25_3_ = local_1e0._9_3_;
  sampleParams.sampler.compare = local_1e0._12_4_;
  sampleParams.sampler.wrapS = local_1f0._0_4_;
  sampleParams.sampler.wrapT = local_1f0._4_4_;
  sampleParams.sampler._8_8_ = pp_Stack_1e8;
  sampleParams.sampler._32_8_ = local_1d0._M_p;
  sampleParams.sampler.borderColor.v.uData[1] = local_1c8;
  sampleParams.super_RenderParams.samplerType =
       glu::TextureTestUtil::getSamplerType
                 ((pTVar4->m_refTexture).super_TextureLevelPyramid.m_format);
  sampleParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
  sampleParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
  sampleParams.super_RenderParams.colorBias.m_data[2] = fmtInfo.lookupBias.m_data[2];
  sampleParams.super_RenderParams.colorBias.m_data[3] = fmtInfo.lookupBias.m_data[3];
  sampleParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
  sampleParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
  sampleParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
  sampleParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
  sampleParams.super_RenderParams.flags =
       (uint)(CVar2 == COORDTYPE_PROJECTED) + (uint)(CVar2 == COORDTYPE_BASIC_BIAS) * 2;
  (**(code **)(lVar14 + 0xb8))(0x806f,this->m_texture->m_glTexture);
  (**(code **)(lVar14 + 0x1360))(0x806f,0x2802,this->m_wrapS);
  (**(code **)(lVar14 + 0x1360))(0x806f,0x2803,this->m_wrapT);
  (**(code **)(lVar14 + 0x1360))(0x806f,0x8072,this->m_wrapR);
  (**(code **)(lVar14 + 0x1360))(0x806f,0x2801,this->m_minFilter);
  (**(code **)(lVar14 + 0x1360))(0x806f,0x2800,0x2600);
  dVar10 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar10,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureMipmapTests.cpp"
                  ,0x505);
  if (iterate()::s_projections == '\0') {
    iterate();
  }
  iVar8 = iVar8 >> 2;
  iVar11 = iVar11 >> 2;
  local_478 = &this->m_renderer;
  lVar20 = 0;
  lVar12 = 0;
  do {
    iVar9 = iVar11 * (int)lVar12;
    iVar16 = 0;
    iVar21 = 0;
    local_480 = lVar20;
    local_470 = lVar12;
    for (lVar18 = 0; lVar18 != 0x40; lVar18 = lVar18 + 0x10) {
      iVar6 = viewport.width + iVar21;
      if (lVar18 != 0x30) {
        iVar6 = iVar8;
      }
      iVar7 = viewport.height - iVar9;
      if (local_470 != 3) {
        iVar7 = iVar11;
      }
      CVar3 = this->m_coordType;
      uVar19 = (uint)lVar20;
      if (CVar3 < COORDTYPE_AFFINE) {
LAB_01151ac1:
        getBasicTexCoord3D(&texCoord,uVar19);
      }
      else if (CVar3 == COORDTYPE_AFFINE) {
        getAffineTexCoord3D(&texCoord,uVar19);
      }
      else if (CVar3 == COORDTYPE_PROJECTED) goto LAB_01151ac1;
      if (CVar2 == COORDTYPE_PROJECTED) {
        sampleParams.super_RenderParams.w.m_data._0_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar18);
        sampleParams.super_RenderParams.w.m_data._8_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar18 + 8);
      }
      if (CVar2 == COORDTYPE_BASIC_BIAS) {
        sampleParams.super_RenderParams.bias =
             deqp::gles2::Accuracy::Texture2DMipmapCase::iterate::s_bias[uVar19 & 7];
      }
      (**(code **)(lVar14 + 0x1a00))(viewport.x + iVar16,viewport.y + iVar9,iVar6,iVar7);
      lVar20 = lVar20 + 1;
      iVar21 = iVar21 - iVar8;
      iVar16 = iVar16 + iVar8;
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (local_478,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&sampleParams.super_RenderParams);
    }
    lVar12 = local_470 + 1;
    lVar20 = local_480 + 4;
  } while (lVar12 != 4);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  res_1.m_data[0] = 8;
  res_1.m_data[1] = 3;
  pvVar17 = (void *)renderedFrame.m_pixels.m_cap;
  if (renderedFrame.m_pixels.m_cap != 0) {
    pvVar17 = renderedFrame.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1f0,(TextureFormat *)&res_1,renderedFrame.m_width,
             renderedFrame.m_height,1,pvVar17);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1f0);
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar19 = this->m_minFilter;
  tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&errorMask,viewport.width,viewport.height);
  local_358 = &pRVar13->m_pixelFormat;
  lVar14 = 0;
  do {
    *(undefined4 *)(local_21c + lVar14 * 4) = 0x16;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  lVar14 = 3;
  do {
    *(undefined4 *)(local_21c + lVar14 * 4) = 0x10;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 6);
  local_204._0_4_ = 0.0;
  local_204._4_4_ = 0.0;
  pp_Stack_1fc = (_func_int **)0x0;
  local_1f4.m_data[0] = true;
  local_1f4.m_data[1] = true;
  local_1f4.m_data[2] = true;
  local_1f4.m_data[3] = true;
  lodPrec.rule = RULE_OPENGL;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  local_21c._0_4_ = 0x14;
  local_21c._4_4_ = 0x14;
  local_21c._8_4_ = 0x14;
  local_21c._12_4_ = 0x10;
  local_21c._16_4_ = 0x10;
  local_21c._20_4_ = 0x10;
  local_418._0_4_ = (pRVar13->m_pixelFormat).redBits;
  local_418._4_4_ = (pRVar13->m_pixelFormat).greenBits;
  local_418._8_4_ = (pRVar13->m_pixelFormat).blueBits;
  local_418._12_4_ = (pRVar13->m_pixelFormat).alphaBits;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar14 = 0;
  do {
    res.m_data[lVar14] = *(int *)(local_418 + lVar14 * 4) + ~(uint)((uVar19 & 0xfffffffe) == 0x2702)
    ;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  local_448._0_4_ = R;
  local_448._4_4_ = SNORM_INT8;
  local_448._8_8_ = 0;
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  res_1.m_data[2] = 0;
  res_1.m_data[3] = 0;
  lVar14 = 0;
  do {
    iVar9 = *(int *)(local_448 + lVar14 * 4);
    if (*(int *)(local_448 + lVar14 * 4) < res.m_data[lVar14]) {
      iVar9 = res.m_data[lVar14];
    }
    res_1.m_data[lVar14] = iVar9;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  tcu::computeFixedPointThreshold((tcu *)local_1f0,&res_1);
  local_204._0_4_ = (float)local_1f0._0_4_;
  local_204._4_4_ = (float)local_1f0._4_4_;
  pp_Stack_1fc = pp_Stack_1e8;
  local_1f4.m_data[1] = 0 < (pRVar13->m_pixelFormat).greenBits;
  local_1f4.m_data[0] = 0 < (pRVar13->m_pixelFormat).redBits;
  local_1f4.m_data[2] = 0 < (pRVar13->m_pixelFormat).blueBits;
  local_1f4.m_data[3] = 0 < (pRVar13->m_pixelFormat).alphaBits;
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = (uint)(CVar2 != COORDTYPE_PROJECTED) * 2 + 6;
  local_4c0 = 0;
  lVar14 = 0;
  local_4d4 = 0;
  do {
    local_478 = (TextureRenderer *)
                (deqp::gles2::Accuracy::Texture2DMipmapCase::iterate::s_bias + ((uint)local_4c0 & 7)
                );
    iVar9 = iVar11 * (int)lVar14;
    lVar12 = 0;
    iVar21 = 0;
    iVar16 = 0;
    local_480 = lVar14;
    local_360 = local_4c0;
    do {
      local_470 = CONCAT44(local_470._4_4_,iVar16);
      iVar16 = viewport.width + iVar16;
      if (lVar12 != 0x30) {
        iVar16 = iVar8;
      }
      iVar6 = viewport.height - iVar9;
      if (local_480 != 3) {
        iVar6 = iVar11;
      }
      CVar3 = this->m_coordType;
      if (CVar3 < COORDTYPE_AFFINE) {
LAB_01151e4c:
        getBasicTexCoord3D(&texCoord,(int)local_4c0);
      }
      else if (CVar3 == COORDTYPE_AFFINE) {
        getAffineTexCoord3D(&texCoord,(int)local_4c0);
      }
      else if (CVar3 == COORDTYPE_PROJECTED) goto LAB_01151e4c;
      if (CVar2 == COORDTYPE_PROJECTED) {
        sampleParams.super_RenderParams.w.m_data._0_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar12);
        sampleParams.super_RenderParams.w.m_data._8_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar12 + 8);
      }
      if (CVar2 == COORDTYPE_BASIC_BIAS) {
        sampleParams.super_RenderParams.bias = *(float *)local_478;
      }
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_1f0,&referenceFrame,local_358,iVar21,iVar9,iVar16,iVar6);
      res_1.m_data._8_8_ = (local_350->m_refTexture).m_view.m_levels;
      res_1.m_data[0] = (local_350->m_refTexture).m_view.m_numLevels;
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_1f0,(Texture3DView *)&res_1,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&sampleParams);
      res.m_data[0] = 8;
      res.m_data[1] = 3;
      pvVar17 = (void *)renderedFrame.m_pixels.m_cap;
      if (renderedFrame.m_pixels.m_cap != 0) {
        pvVar17 = renderedFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res_1,(TextureFormat *)&res,renderedFrame.m_width,
                 renderedFrame.m_height,1,pvVar17);
      tcu::getSubregion((PixelBufferAccess *)local_1f0,(PixelBufferAccess *)&res_1,iVar21,iVar9,
                        iVar16,iVar6);
      local_448._0_4_ = RGBA;
      local_448._4_4_ = UNORM_INT8;
      pvVar17 = (void *)referenceFrame.m_pixels.m_cap;
      if (referenceFrame.m_pixels.m_cap != 0) {
        pvVar17 = referenceFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_418,(TextureFormat *)local_448,referenceFrame.m_width,
                 referenceFrame.m_height,1,pvVar17);
      tcu::getSubregion((PixelBufferAccess *)&res,(PixelBufferAccess *)local_418,iVar21,iVar9,iVar16
                        ,iVar6);
      local_370.m_numLevels = 8;
      local_370._4_4_ = 3;
      pvVar17 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar17 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_3c0,(TextureFormat *)&local_370,errorMask.m_width,
                 errorMask.m_height,1,pvVar17);
      tcu::getSubregion((PixelBufferAccess *)local_448,(PixelBufferAccess *)local_3c0,iVar21,iVar9,
                        iVar16,iVar6);
      local_370.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
      local_370.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
      iVar16 = glu::TextureTestUtil::computeTextureLookupDiff
                         ((ConstPixelBufferAccess *)local_1f0,(ConstPixelBufferAccess *)&res,
                          (PixelBufferAccess *)local_448,&local_370,
                          texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,&sampleParams,
                          (LookupPrecision *)local_21c,&lodPrec,
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                          m_watchDog);
      local_4d4 = local_4d4 + iVar16;
      iVar16 = (int)local_470 - iVar8;
      iVar21 = iVar21 + iVar8;
      lVar12 = lVar12 + 0x10;
      local_4c0 = (ulong)((int)local_4c0 + 1);
      local_478 = (TextureRenderer *)((long)local_478 + 4);
    } while (lVar12 != 0x40);
    lVar14 = local_480 + 1;
    local_4c0 = (ulong)((int)local_360 + 4);
    if (lVar14 == 4) {
      if (0 < local_4d4) {
        local_1f0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1e8,"ERROR: Image verification failed, found ",0x28);
        std::ostream::operator<<((ostringstream *)&pp_Stack_1e8,local_4d4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1e8," invalid pixels!",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e8);
        std::ios_base::~ios_base(local_178);
      }
      pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      res.m_data._0_8_ = &local_498;
      std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Result","");
      local_418._0_8_ = (long)local_418 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"Verification result","");
      tcu::LogImageSet::LogImageSet((LogImageSet *)&res_1,(string *)&res,(string *)local_418);
      tcu::TestLog::startImageSet(pTVar5,(char *)res_1.m_data._0_8_,local_328._M_p);
      local_448._0_8_ = (long)local_448 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"Rendered","");
      TVar1 = (TextureFormat)((long)local_3c0 + 0x10);
      local_3c0._0_8_ = TVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"Rendered image","");
      pSVar15 = &renderedFrame;
      tcu::LogImage::LogImage
                ((LogImage *)local_1f0,(string *)local_448,(string *)local_3c0,pSVar15,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1f0,(int)pTVar5,__buf,(size_t)pSVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_p != aaStack_1c0) {
        operator_delete(local_1d0._M_p,
                        CONCAT44(aaStack_1c0[0]._M_allocated_capacity._4_4_,
                                 (undefined4)aaStack_1c0[0]._M_allocated_capacity) + 1);
      }
      if (local_1f0 != (undefined1  [8])&local_1e0) {
        operator_delete((void *)local_1f0,local_1e0._M_allocated_capacity + 1);
      }
      if ((TextureFormat)local_3c0._0_8_ != TVar1) {
        operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ + 1);
      }
      if (local_448._0_8_ != (long)local_448 + 0x10) {
        operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_p != local_318) {
        operator_delete(local_328._M_p,local_318[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)res_1.m_data._0_8_ != &local_338) {
        operator_delete((void *)res_1.m_data._0_8_,local_338._M_allocated_capacity + 1);
      }
      if (local_418._0_8_ != (long)local_418 + 0x10) {
        operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)res.m_data._0_8_ != &local_498) {
        operator_delete((void *)res.m_data._0_8_,local_498._M_allocated_capacity + 1);
      }
      if (0 < local_4d4) {
        pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        res.m_data._0_8_ = &local_498;
        std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Reference","");
        local_418._0_8_ = (long)local_418 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"Ideal reference","");
        pSVar15 = &referenceFrame;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1f0,(string *)&res,(string *)local_418,pSVar15,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar8 = (int)pTVar5;
        tcu::LogImage::write((LogImage *)local_1f0,iVar8,__buf_00,(size_t)pSVar15);
        local_448._0_8_ = (long)local_448 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"ErrorMask","");
        local_3c0._0_8_ = TVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"Error mask","");
        pSVar15 = &errorMask;
        tcu::LogImage::LogImage
                  ((LogImage *)&res_1,(string *)local_448,(string *)local_3c0,pSVar15,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&res_1,iVar8,__buf_01,(size_t)pSVar15);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_p != local_318) {
          operator_delete(local_328._M_p,local_318[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)res_1.m_data._0_8_ != &local_338) {
          operator_delete((void *)res_1.m_data._0_8_,local_338._M_allocated_capacity + 1);
        }
        if ((TextureFormat)local_3c0._0_8_ != TVar1) {
          operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ + 1);
        }
        if (local_448._0_8_ != (long)local_448 + 0x10) {
          operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_p != aaStack_1c0) {
          operator_delete(local_1d0._M_p,
                          CONCAT44(aaStack_1c0[0]._M_allocated_capacity._4_4_,
                                   (undefined4)aaStack_1c0[0]._M_allocated_capacity) + 1);
        }
        if (local_1f0 != (undefined1  [8])&local_1e0) {
          operator_delete((void *)local_1f0,local_1e0._M_allocated_capacity + 1);
        }
        if (local_418._0_8_ != (long)local_418 + 0x10) {
          operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)res.m_data._0_8_ != &local_498) {
          operator_delete((void *)res.m_data._0_8_,local_498._M_allocated_capacity + 1);
        }
      }
      tcu::TestLog::endImageSet
                (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      description = "Pass";
      if (local_4d4 != 0) {
        description = "Image verification failed";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (uint)(local_4d4 != 0),description);
      tcu::Surface::~Surface(&errorMask);
      tcu::Surface::~Surface(&referenceFrame);
      if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      tcu::Surface::~Surface(&renderedFrame);
      return STOP;
    }
  } while( true );
}

Assistant:

Texture3DMipmapCase::IterateResult Texture3DMipmapCase::iterate (void)
{
	const glw::Functions&			gl					= m_context.getRenderContext().getFunctions();

	const tcu::Texture3D&			refTexture			= m_texture->getRefTexture();
	const tcu::TextureFormat&		texFmt				= refTexture.getFormat();
	const tcu::TextureFormatInfo	fmtInfo				= tcu::getTextureFormatInfo(texFmt);
	const int						texWidth			= refTexture.getWidth();
	const int						texHeight			= refTexture.getHeight();
	const deUint32					magFilter			= GL_NEAREST;

	const tcu::RenderTarget&		renderTarget		= m_context.getRenderContext().getRenderTarget();
	const RandomViewport			viewport			(renderTarget, texWidth*4, texHeight*4, deStringHash(getName()));

	const bool						isProjected			= m_coordType == COORDTYPE_PROJECTED;
	const bool						useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	// Viewport is divided into 4x4 grid.
	const int						gridWidth			= 4;
	const int						gridHeight			= 4;
	const int						cellWidth			= viewport.width / gridWidth;
	const int						cellHeight			= viewport.height / gridHeight;

	ReferenceParams					sampleParams		(TEXTURETYPE_3D);

	tcu::Surface					renderedFrame		(viewport.width, viewport.height);
	vector<float>					texCoord;

	// Sampling parameters.
	sampleParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_wrapR, m_minFilter, magFilter);
	sampleParams.samplerType	= getSamplerType(texFmt);
	sampleParams.colorBias		= fmtInfo.lookupBias;
	sampleParams.colorScale		= fmtInfo.lookupScale;
	sampleParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);

	// Bind texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_3D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R,		m_wrapR);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 2.0f),
		Vec4(0.8f, 1.0f, 1.7f, 0.6f),
		Vec4(1.2f, 1.0f, 1.7f, 1.5f)
	};

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			const int		curX		= cellWidth*gridX;
			const int		curY		= cellHeight*gridY;
			const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			const int		cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			switch (m_coordType)
			{
				case COORDTYPE_BASIC_BIAS:	// Fall-through.
				case COORDTYPE_PROJECTED:
				case COORDTYPE_BASIC:		getBasicTexCoord3D	(texCoord, cellNdx);	break;
				case COORDTYPE_AFFINE:		getAffineTexCoord3D	(texCoord, cellNdx);	break;
				default:					DE_ASSERT(DE_FALSE);
			}

			// Set projection.
			if (isProjected)
				sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

			// Set LOD bias.
			if (useLodBias)
				sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

			// Render with GL.
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		}
	}

	// Read result.
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log
	{
		const tcu::PixelFormat&	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const bool				isTrilinear		= m_minFilter == GL_NEAREST_MIPMAP_LINEAR || m_minFilter == GL_LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewport.width, viewport.height);
		tcu::Surface			errorMask		(viewport.width, viewport.height);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 20);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 16); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= isProjected ? 6 : 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int		curX		= cellWidth*gridX;
				const int		curY		= cellHeight*gridY;
				const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
				const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
				const int		cellNdx		= gridY*gridWidth + gridX;

				switch (m_coordType)
				{
					case COORDTYPE_BASIC_BIAS:	// Fall-through.
					case COORDTYPE_PROJECTED:
					case COORDTYPE_BASIC:		getBasicTexCoord3D	(texCoord, cellNdx);	break;
					case COORDTYPE_AFFINE:		getAffineTexCoord3D	(texCoord, cellNdx);	break;
					default:					DE_ASSERT(DE_FALSE);
				}

				if (isProjected)
					sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

				if (useLodBias)
					sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], sampleParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getRefTexture(), &texCoord[0], sampleParams,
															lookupPrec, lodPrec, m_testCtx.getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
							<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
								<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}